

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fscope_end(FuncState *fs)

{
  MSize MVar1;
  FuncScope *in_RDI;
  LexState *unaff_retaddr;
  MSize idx;
  LexState *ls;
  FuncScope *bl;
  BCPos in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint8_t info;
  LexState *ls_00;
  FuncState *fs_00;
  
  info = (uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  fs_00 = *(FuncState **)&in_RDI[1].vstart;
  ls_00 = *(LexState **)&in_RDI->vstart;
  *(GCtab **)&in_RDI[1].vstart = fs_00->kt;
  var_remove(ls_00,(uint)*(byte *)((long)&fs_00->ls + 4));
  *(MSize *)((long)&in_RDI[3].prev + 4) = in_RDI[3].vstart;
  if (((ulong)fs_00->ls & 0x180000000000) == 0x80000000000) {
    bcemit_INS(fs_00,(BCIns)((ulong)ls_00 >> 0x20));
  }
  if (((ulong)fs_00->ls & 0x20000000000) != 0) {
    if (((ulong)fs_00->ls & 0x10000000000) == 0) {
      gola_fixup(unaff_retaddr,in_RDI);
      return;
    }
    MVar1 = gola_new((LexState *)fs_00,(GCstr *)ls_00,info,in_stack_ffffffffffffffe0);
    ls_00->vtop = MVar1;
    gola_resolve(unaff_retaddr,in_RDI,(MSize)((ulong)fs_00 >> 0x20));
  }
  if (((ulong)fs_00->ls & 0x40000000000) != 0) {
    gola_fixup(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

static void fscope_end(FuncState *fs)
{
  FuncScope *bl = fs->bl;
  LexState *ls = fs->ls;
  fs->bl = bl->prev;
  var_remove(ls, bl->nactvar);
  fs->freereg = fs->nactvar;
  lj_assertFS(bl->nactvar == fs->nactvar, "bad regalloc");
  if ((bl->flags & (FSCOPE_UPVAL|FSCOPE_NOCLOSE)) == FSCOPE_UPVAL)
    bcemit_AJ(fs, BC_UCLO, bl->nactvar, 0);
  if ((bl->flags & FSCOPE_BREAK)) {
    if ((bl->flags & FSCOPE_LOOP)) {
      MSize idx = gola_new(ls, NAME_BREAK, VSTACK_LABEL, fs->pc);
      ls->vtop = idx;  /* Drop break label immediately. */
      gola_resolve(ls, bl, idx);
    } else {  /* Need the fixup step to propagate the breaks. */
      gola_fixup(ls, bl);
      return;
    }
  }
  if ((bl->flags & FSCOPE_GOLA)) {
    gola_fixup(ls, bl);
  }
}